

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

bool ot::commissioner::tlv::IsDatasetParameter(bool aIsActiveDataset,Type aTlvType)

{
  initializer_list<ot::commissioner::tlv::Type> __l;
  initializer_list<ot::commissioner::tlv::Type> __l_00;
  int iVar1;
  size_type sVar2;
  set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
  *local_78;
  allocator<ot::commissioner::tlv::Type> local_5e;
  less<ot::commissioner::tlv::Type> local_5d;
  Type local_5c [12];
  iterator local_50;
  size_type local_48;
  allocator<ot::commissioner::tlv::Type> local_2c;
  less<ot::commissioner::tlv::Type> local_2b;
  Type local_2a [10];
  iterator local_20;
  size_type local_18;
  Type local_a;
  byte local_9;
  Type aTlvType_local;
  bool aIsActiveDataset_local;
  
  local_a = aTlvType;
  local_9 = aIsActiveDataset;
  if (IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet == '\0') {
    iVar1 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet);
    if (iVar1 != 0) {
      local_2a[0] = kActiveTimestamp;
      local_2a[1] = 0;
      local_2a[2] = 0x35;
      local_2a[3] = 2;
      local_2a[4] = 7;
      local_2a[5] = 5;
      local_2a[6] = 3;
      local_2a[7] = 1;
      local_2a[8] = 4;
      local_2a[9] = 0xc;
      local_20 = local_2a;
      local_18 = 10;
      std::allocator<ot::commissioner::tlv::Type>::allocator(&local_2c);
      __l_00._M_len = local_18;
      __l_00._M_array = local_20;
      std::
      set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
      ::set(&IsDatasetParameter::kActiveSet,__l_00,&local_2b,&local_2c);
      std::allocator<ot::commissioner::tlv::Type>::~allocator(&local_2c);
      __cxa_atexit(std::
                   set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                   ::~set,&IsDatasetParameter::kActiveSet,&__dso_handle);
      __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kActiveSet);
    }
  }
  if (IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet == '\0') {
    iVar1 = __cxa_guard_acquire(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet);
    if (iVar1 != 0) {
      local_5c[0] = kActiveTimestamp;
      local_5c[1] = 0;
      local_5c[2] = 0x35;
      local_5c[3] = 0x34;
      local_5c[4] = 2;
      local_5c[5] = 7;
      local_5c[6] = 5;
      local_5c[7] = 3;
      local_5c[8] = 1;
      local_5c[9] = 0x33;
      local_5c[10] = 4;
      local_5c[0xb] = 0xc;
      local_50 = local_5c;
      local_48 = 0xc;
      std::allocator<ot::commissioner::tlv::Type>::allocator(&local_5e);
      __l._M_len = local_48;
      __l._M_array = local_50;
      std::
      set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
      ::set(&IsDatasetParameter::kPendingSet,__l,&local_5d,&local_5e);
      std::allocator<ot::commissioner::tlv::Type>::~allocator(&local_5e);
      __cxa_atexit(std::
                   set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
                   ::~set,&IsDatasetParameter::kPendingSet,&__dso_handle);
      __cxa_guard_release(&IsDatasetParameter(bool,ot::commissioner::tlv::Type)::kPendingSet);
    }
  }
  if ((local_9 & 1) == 0) {
    local_78 = &IsDatasetParameter::kPendingSet;
  }
  else {
    local_78 = &IsDatasetParameter::kActiveSet;
  }
  sVar2 = std::
          set<ot::commissioner::tlv::Type,_std::less<ot::commissioner::tlv::Type>,_std::allocator<ot::commissioner::tlv::Type>_>
          ::count(local_78,&local_a);
  return sVar2 != 0;
}

Assistant:

bool IsDatasetParameter(bool aIsActiveDataset, tlv::Type aTlvType)
{
    static const std::set<tlv::Type> kActiveSet = {tlv::Type::kActiveTimestamp,
                                                   tlv::Type::kChannel,
                                                   tlv::Type::kChannelMask,
                                                   tlv::Type::kExtendedPanId,
                                                   tlv::Type::kNetworkMeshLocalPrefix,
                                                   tlv::Type::kNetworkMasterKey,
                                                   tlv::Type::kNetworkName,
                                                   tlv::Type::kPanId,
                                                   tlv::Type::kPSKc,
                                                   tlv::Type::kSecurityPolicy};

    static const std::set<tlv::Type> kPendingSet = {
        tlv::Type::kActiveTimestamp,  tlv::Type::kChannel,       tlv::Type::kChannelMask,
        tlv::Type::kDelayTimer,       tlv::Type::kExtendedPanId, tlv::Type::kNetworkMeshLocalPrefix,
        tlv::Type::kNetworkMasterKey, tlv::Type::kNetworkName,   tlv::Type::kPanId,
        tlv::Type::kPendingTimestamp, tlv::Type::kPSKc,          tlv::Type::kSecurityPolicy};

    return (aIsActiveDataset ? kActiveSet : kPendingSet).count(aTlvType) != 0;
}